

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffgrsz(fitsfile *fptr,long *ndata,int *status)

{
  undefined1 auVar1 [16];
  int iVar2;
  long *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int bytesperpixel;
  int typecode;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  long local_38;
  int *in_stack_ffffffffffffffd0;
  long lVar3;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
       (iVar2 = ffrdef(in_stack_000000d8,in_stack_000000d0), 0 < iVar2)) {
      return (int)*in_RDX;
    }
  }
  else {
    ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
  }
  if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
    ffgtcl((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
           (int)((ulong)in_RDI >> 0x20),(int *)in_RSI,in_RDX,
           (long *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
           in_stack_ffffffffffffffd0);
    *in_RSI = (long)(int)(0x1b6c0 / (long)(in_stack_ffffffffffffffdc / 10));
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 2) + 0x3c8) < 1) {
      lVar3 = 1;
    }
    else {
      lVar3 = *(long *)(*(long *)(in_RDI + 2) + 0x3c8);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(0x1b6c0),8);
    *in_RSI = SUB168((auVar1 << 0x40 | ZEXT816(0x1b6c0)) / SEXT816(lVar3),0);
    if (*in_RSI < 1) {
      local_38 = 1;
    }
    else {
      local_38 = *in_RSI;
    }
    *in_RSI = local_38;
  }
  return (int)*in_RDX;
}

Assistant:

int ffgrsz( fitsfile *fptr, /* I - FITS file pionter                        */
            long *ndata,    /* O - optimal amount of data to access         */
            int  *status)   /* IO - error status                            */
/*
  Returns an optimal value for the number of rows in a binary table
  or the number of pixels in an image that should be read or written
  at one time for maximum efficiency. Accessing more data than this
  may cause excessive flushing and rereading of buffers to/from disk.
*/
{
    int typecode, bytesperpixel;

    /* There are NIOBUF internal buffers available each IOBUFLEN bytes long. */

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
      if ( ffrdef(fptr, status) > 0)   /* rescan header to get hdu struct */
           return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU ) /* calc pixels per buffer size */
    {
      /* image pixels are in column 2 of the 'table' */
      ffgtcl(fptr, 2, &typecode, NULL, NULL, status);
      bytesperpixel = typecode / 10;
      *ndata = ((NIOBUF - 1) * IOBUFLEN) / bytesperpixel;
    }
    else   /* calc number of rows that fit in buffers */
    {
      *ndata = (long) (((NIOBUF - 1) * IOBUFLEN) / maxvalue(1,
               (fptr->Fptr)->rowlength));
      *ndata = maxvalue(1, *ndata); 
    }

    return(*status);
}